

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_ddf01b::TGlslangToSpvTraverser::addMeshNVDecoration
          (TGlslangToSpvTraverser *this,Id id,int member,TQualifier *qualifier)

{
  set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_> *psVar1;
  TIntermediate *pTVar2;
  const_iterator cVar3;
  ulong uVar4;
  _Rb_tree_header *p_Var5;
  char *pcVar6;
  key_type local_50;
  
  pTVar2 = this->glslangIntermediate;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"GL_EXT_mesh_shader","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(pTVar2->requestedExtensions)._M_t,&local_50);
  p_Var5 = &(this->glslangIntermediate->requestedExtensions)._M_t._M_impl.super__Rb_tree_header;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  uVar4 = *(ulong *)&qualifier->field_0x8;
  if (member < 0) {
    if ((uVar4 >> 0x29 & 1) != 0) {
      if (this->glslangIntermediate->language == EShLangFragment) {
        psVar1 = &(this->builder).capabilities;
        if ((_Rb_tree_header *)cVar3._M_node == p_Var5) {
          local_50._M_dataplus._M_p._0_4_ = 0x1492;
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)psVar1,(Capability *)&local_50);
          pcVar6 = "SPV_NV_mesh_shader";
        }
        else {
          local_50._M_dataplus._M_p._0_4_ = 0x14a3;
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)psVar1,(Capability *)&local_50);
          pcVar6 = "SPV_EXT_mesh_shader";
        }
        spv::Builder::addExtension(&this->builder,pcVar6);
      }
      spv::Builder::addDecoration(&this->builder,id,DecorationPerPrimitiveEXT,-1);
      uVar4 = *(ulong *)&qualifier->field_0x8;
    }
    if ((uVar4 & 0x40000000000) != 0) {
      spv::Builder::addDecoration(&this->builder,id,DecorationPerViewNV,-1);
      uVar4 = *(ulong *)&qualifier->field_0x8;
    }
    if ((uVar4 & 0x80000000000) != 0) {
      spv::Builder::addDecoration(&this->builder,id,DecorationPerTaskNV,-1);
    }
  }
  else {
    if ((uVar4 >> 0x29 & 1) != 0) {
      if (this->glslangIntermediate->language == EShLangFragment) {
        psVar1 = &(this->builder).capabilities;
        if ((_Rb_tree_header *)cVar3._M_node == p_Var5) {
          local_50._M_dataplus._M_p._0_4_ = 0x1492;
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)psVar1,(Capability *)&local_50);
          pcVar6 = "SPV_NV_mesh_shader";
        }
        else {
          local_50._M_dataplus._M_p._0_4_ = 0x14a3;
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)psVar1,(Capability *)&local_50);
          pcVar6 = "SPV_EXT_mesh_shader";
        }
        spv::Builder::addExtension(&this->builder,pcVar6);
      }
      spv::Builder::addMemberDecoration(&this->builder,id,member,DecorationPerPrimitiveEXT,-1);
      uVar4 = *(ulong *)&qualifier->field_0x8;
    }
    if ((uVar4 & 0x40000000000) != 0) {
      spv::Builder::addMemberDecoration(&this->builder,id,member,DecorationPerViewNV,-1);
      uVar4 = *(ulong *)&qualifier->field_0x8;
    }
    if ((uVar4 & 0x80000000000) != 0) {
      spv::Builder::addMemberDecoration(&this->builder,id,member,DecorationPerTaskNV,-1);
    }
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::addMeshNVDecoration(spv::Id id, int member, const glslang::TQualifier& qualifier)
{
    bool isMeshShaderExt = (glslangIntermediate->getRequestedExtensions().find(glslang::E_GL_EXT_mesh_shader) !=
                            glslangIntermediate->getRequestedExtensions().end());

    if (member >= 0) {
        if (qualifier.perPrimitiveNV) {
            // Need to add capability/extension for fragment shader.
            // Mesh shader already adds this by default.
            if (glslangIntermediate->getStage() == EShLangFragment) {
                if(isMeshShaderExt) {
                    builder.addCapability(spv::CapabilityMeshShadingEXT);
                    builder.addExtension(spv::E_SPV_EXT_mesh_shader);
                } else {
                    builder.addCapability(spv::CapabilityMeshShadingNV);
                    builder.addExtension(spv::E_SPV_NV_mesh_shader);
                }
            }
            builder.addMemberDecoration(id, (unsigned)member, spv::DecorationPerPrimitiveNV);
        }
        if (qualifier.perViewNV)
            builder.addMemberDecoration(id, (unsigned)member, spv::DecorationPerViewNV);
        if (qualifier.perTaskNV)
            builder.addMemberDecoration(id, (unsigned)member, spv::DecorationPerTaskNV);
    } else {
        if (qualifier.perPrimitiveNV) {
            // Need to add capability/extension for fragment shader.
            // Mesh shader already adds this by default.
            if (glslangIntermediate->getStage() == EShLangFragment) {
                if(isMeshShaderExt) {
                    builder.addCapability(spv::CapabilityMeshShadingEXT);
                    builder.addExtension(spv::E_SPV_EXT_mesh_shader);
                } else {
                    builder.addCapability(spv::CapabilityMeshShadingNV);
                    builder.addExtension(spv::E_SPV_NV_mesh_shader);
                }
            }
            builder.addDecoration(id, spv::DecorationPerPrimitiveNV);
        }
        if (qualifier.perViewNV)
            builder.addDecoration(id, spv::DecorationPerViewNV);
        if (qualifier.perTaskNV)
            builder.addDecoration(id, spv::DecorationPerTaskNV);
    }
}